

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O1

void __thiscall ST::string::set(string *this,wchar_t *wstr,size_t size,utf_validation_t validation)

{
  char *pcVar1;
  ulong uVar2;
  char_buffer local_40;
  
  if (size == 0xffffffffffffffff) {
    if (wstr == (wchar_t *)0x0) {
      size = 0;
    }
    else {
      size = wcslen(wstr);
    }
  }
  utf32_to_utf8(&local_40,wstr,size,validation);
  pcVar1 = (this->m_buffer).m_chars;
  (this->m_buffer).m_chars = local_40.m_chars;
  uVar2 = (this->m_buffer).m_size;
  (this->m_buffer).m_size = local_40.m_size;
  *(undefined8 *)(this->m_buffer).m_data = local_40.m_data._0_8_;
  *(undefined8 *)((this->m_buffer).m_data + 8) = local_40.m_data._8_8_;
  if (local_40.m_size < 0x10) {
    (this->m_buffer).m_chars = (this->m_buffer).m_data;
  }
  if (pcVar1 != (char *)0x0 && 0xf < uVar2) {
    local_40.m_chars = pcVar1;
    local_40.m_size = uVar2;
    operator_delete__(pcVar1);
  }
  return;
}

Assistant:

void set(const wchar_t *wstr, size_t size = ST_AUTO_SIZE,
                 utf_validation_t validation = ST_DEFAULT_VALIDATION)
        {
            if (size == ST_AUTO_SIZE)
                size = wstr ? std::char_traits<wchar_t>::length(wstr) : 0;
            m_buffer = wchar_to_utf8(wstr, size, validation);
        }